

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXTokenizer.cpp
# Opt level: O2

void Assimp::FBX::Tokenize(TokenList *output_tokens,char *input)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  byte *pbVar4;
  byte *pbVar5;
  bool bVar6;
  uint line;
  uint column;
  ulong uVar7;
  bool bVar8;
  allocator local_61;
  char *token_begin;
  char *token_end;
  string local_50;
  
  token_begin = (char *)0x0;
  token_end = (char *)0x0;
  column = 1;
  bVar8 = false;
  bVar6 = false;
  bVar3 = false;
  uVar7 = 1;
  do {
    bVar1 = *input;
    if ((bVar1 - 0xc < 2) || (bVar1 == 10)) {
      uVar7 = (ulong)((int)uVar7 + 1);
      column = 0;
LAB_004ebe73:
      line = (uint)uVar7;
      if (bVar6) {
        pbVar4 = (byte *)token_begin;
        pbVar5 = (byte *)input;
        if (bVar1 == 0x22) {
LAB_004ebeed:
          token_end = (char *)pbVar5;
          anon_unknown_3::ProcessDataToken
                    (output_tokens,&token_begin,&token_end,line,column,TokenType_DATA,false);
LAB_004ebf0c:
          bVar6 = false;
          bVar3 = false;
          bVar8 = false;
        }
        else {
LAB_004ebedc:
          token_begin = (char *)pbVar4;
          bVar6 = true;
          bVar8 = false;
        }
      }
      else {
        if (((bVar1 - 9 < 2) || (bVar1 - 0xc < 2)) || (bVar1 == 0x20)) {
          pbVar5 = (byte *)token_end;
          if (token_begin != (char *)0x0) goto LAB_004ebeed;
          goto LAB_004ebf0c;
        }
        if (bVar1 == 0x7d) {
          anon_unknown_3::ProcessDataToken
                    (output_tokens,&token_begin,&token_end,line,column,TokenType_DATA,false);
          local_50._M_dataplus._M_p = (pointer)operator_new(0x28);
          *(char **)local_50._M_dataplus._M_p = input;
          *(byte **)(local_50._M_dataplus._M_p + 8) = (byte *)input + 1;
          local_50._M_dataplus._M_p[0x10] = '\x01';
          local_50._M_dataplus._M_p[0x11] = '\0';
          local_50._M_dataplus._M_p[0x12] = '\0';
          local_50._M_dataplus._M_p[0x13] = '\0';
LAB_004ec027:
          *(ulong *)(local_50._M_dataplus._M_p + 0x18) = uVar7;
          *(uint *)(local_50._M_dataplus._M_p + 0x20) = column;
          std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>::
          emplace_back<Assimp::FBX::Token_const*>
                    ((vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>> *)
                     output_tokens,(Token **)&local_50);
LAB_004ec05b:
          bVar8 = false;
        }
        else {
          if (bVar1 == 0x2c) {
            if (bVar3) {
              anon_unknown_3::ProcessDataToken
                        (output_tokens,&token_begin,&token_end,line,column,TokenType_DATA,true);
            }
            local_50._M_dataplus._M_p = (pointer)operator_new(0x28);
            *(char **)local_50._M_dataplus._M_p = input;
            *(byte **)(local_50._M_dataplus._M_p + 8) = (byte *)input + 1;
            local_50._M_dataplus._M_p[0x10] = '\x04';
            local_50._M_dataplus._M_p[0x11] = '\0';
            local_50._M_dataplus._M_p[0x12] = '\0';
            local_50._M_dataplus._M_p[0x13] = '\0';
            goto LAB_004ec027;
          }
          if (bVar1 == 0x3a) {
            if (!bVar3) {
              std::__cxx11::string::string((string *)&local_50,"unexpected colon",&local_61);
              anon_unknown_3::TokenizeError(&local_50,line,column);
            }
            anon_unknown_3::ProcessDataToken
                      (output_tokens,&token_begin,&token_end,line,column,TokenType_KEY,true);
            goto LAB_004ec05b;
          }
          if (bVar1 != 0x3b) {
            if (bVar1 == 0x7b) {
              anon_unknown_3::ProcessDataToken
                        (output_tokens,&token_begin,&token_end,line,column,TokenType_DATA,false);
              local_50._M_dataplus._M_p = (pointer)operator_new(0x28);
              *(char **)local_50._M_dataplus._M_p = input;
              *(byte **)(local_50._M_dataplus._M_p + 8) = (byte *)input + 1;
              local_50._M_dataplus._M_p[0x10] = '\0';
              local_50._M_dataplus._M_p[0x11] = '\0';
              local_50._M_dataplus._M_p[0x12] = '\0';
              local_50._M_dataplus._M_p[0x13] = '\0';
              goto LAB_004ec027;
            }
            if (bVar1 == 0x22) {
              pbVar4 = (byte *)input;
              if (token_begin != (char *)0x0) {
                std::__cxx11::string::string
                          ((string *)&local_50,"unexpected double-quote",&local_61);
                anon_unknown_3::TokenizeError(&local_50,line,column);
              }
              goto LAB_004ebedc;
            }
            if (token_begin == (char *)0x0) {
              token_begin = input;
            }
            bVar3 = true;
            token_end = input;
            goto LAB_004ec05b;
          }
          anon_unknown_3::ProcessDataToken
                    (output_tokens,&token_begin,&token_end,line,column,TokenType_DATA,false);
          bVar8 = true;
        }
        bVar6 = false;
      }
    }
    else {
      if (bVar1 == 0) {
        return;
      }
      bVar2 = !bVar8;
      bVar8 = true;
      if (bVar2) goto LAB_004ebe73;
    }
    column = column + (uint)(*input == 9) * 3 + 1;
    input = (char *)((byte *)input + 1);
  } while( true );
}

Assistant:

void Tokenize(TokenList& output_tokens, const char* input)
{
    ai_assert(input);

    // line and column numbers numbers are one-based
    unsigned int line = 1;
    unsigned int column = 1;

    bool comment = false;
    bool in_double_quotes = false;
    bool pending_data_token = false;

    const char* token_begin = NULL, *token_end = NULL;
    for (const char* cur = input;*cur;column += (*cur == '\t' ? ASSIMP_FBX_TAB_WIDTH : 1), ++cur) {
        const char c = *cur;

        if (IsLineEnd(c)) {
            comment = false;

            column = 0;
            ++line;
        }

        if(comment) {
            continue;
        }

        if(in_double_quotes) {
            if (c == '\"') {
                in_double_quotes = false;
                token_end = cur;

                ProcessDataToken(output_tokens,token_begin,token_end,line,column);
                pending_data_token = false;
            }
            continue;
        }

        switch(c)
        {
        case '\"':
            if (token_begin) {
                TokenizeError("unexpected double-quote", line, column);
            }
            token_begin = cur;
            in_double_quotes = true;
            continue;

        case ';':
            ProcessDataToken(output_tokens,token_begin,token_end,line,column);
            comment = true;
            continue;

        case '{':
            ProcessDataToken(output_tokens,token_begin,token_end, line, column);
            output_tokens.push_back(new_Token(cur,cur+1,TokenType_OPEN_BRACKET,line,column));
            continue;

        case '}':
            ProcessDataToken(output_tokens,token_begin,token_end,line,column);
            output_tokens.push_back(new_Token(cur,cur+1,TokenType_CLOSE_BRACKET,line,column));
            continue;

        case ',':
            if (pending_data_token) {
                ProcessDataToken(output_tokens,token_begin,token_end,line,column,TokenType_DATA,true);
            }
            output_tokens.push_back(new_Token(cur,cur+1,TokenType_COMMA,line,column));
            continue;

        case ':':
            if (pending_data_token) {
                ProcessDataToken(output_tokens,token_begin,token_end,line,column,TokenType_KEY,true);
            }
            else {
                TokenizeError("unexpected colon", line, column);
            }
            continue;
        }

        if (IsSpaceOrNewLine(c)) {

            if (token_begin) {
                // peek ahead and check if the next token is a colon in which
                // case this counts as KEY token.
                TokenType type = TokenType_DATA;
                for (const char* peek = cur;  *peek && IsSpaceOrNewLine(*peek); ++peek) {
                    if (*peek == ':') {
                        type = TokenType_KEY;
                        cur = peek;
                        break;
                    }
                }

                ProcessDataToken(output_tokens,token_begin,token_end,line,column,type);
            }

            pending_data_token = false;
        }
        else {
            token_end = cur;
            if (!token_begin) {
                token_begin = cur;
            }

            pending_data_token = true;
        }
    }
}